

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# D3MFImporter.cpp
# Opt level: O3

void __thiscall Assimp::D3MF::XmlSerializer::ImportXml(XmlSerializer *this,aiScene *scene)

{
  pointer pMVar1;
  pointer pMVar2;
  ulong uVar3;
  pointer __src;
  pointer __src_00;
  aiNode **__src_01;
  iterator iVar4;
  char *pcVar5;
  bool bVar6;
  int iVar7;
  uint uVar8;
  aiNode *paVar9;
  undefined4 extraout_var;
  aiMetadata *paVar10;
  aiString *paVar11;
  aiMetadataEntry *__s;
  undefined4 *puVar12;
  aiMesh **__s_00;
  aiMaterial **__dest;
  aiNode **__s_01;
  ulong uVar13;
  aiString *paVar14;
  long lVar15;
  size_t sVar16;
  ulong uVar17;
  ulong uVar18;
  vector<aiNode_*,_std::allocator<aiNode_*>_> children;
  string nodeName;
  aiNode **local_488;
  iterator iStack_480;
  aiNode **local_478;
  aiMetadata *local_468;
  undefined1 *local_460;
  char *local_458;
  undefined1 local_450 [16];
  aiString *local_440;
  undefined8 local_438;
  
  if (scene != (aiScene *)0x0) {
    paVar9 = (aiNode *)operator_new(0x478);
    aiNode::aiNode(paVar9);
    scene->mRootNode = paVar9;
    local_478 = (aiNode **)0x0;
    local_488 = (aiNode **)0x0;
    iStack_480._M_current = (aiNode **)0x0;
    local_460 = local_450;
    local_458 = (char *)0x0;
    local_450[0] = 0;
LAB_00651dd0:
    bVar6 = ReadToEndElement(this,(string *)XmlTag::model_abi_cxx11_);
    if (bVar6) {
      iVar7 = (*this->xmlReader->_vptr_IIrrXMLReader[0xd])();
      pcVar5 = local_458;
      strlen((char *)CONCAT44(extraout_var,iVar7));
      std::__cxx11::string::_M_replace((ulong)&local_460,0,pcVar5,CONCAT44(extraout_var,iVar7));
      pcVar5 = local_458;
      if (local_458 != _DAT_008ceed0) {
LAB_00651e46:
        if (pcVar5 == DAT_008cf0f0) {
          if (pcVar5 == (char *)0x0) goto LAB_00651dd0;
          iVar7 = bcmp(local_460,XmlTag::build_abi_cxx11_,(size_t)pcVar5);
          if (iVar7 == 0) goto LAB_00651dd0;
        }
        if (pcVar5 == DAT_008cf170) {
          if (pcVar5 != (char *)0x0) {
            iVar7 = bcmp(local_460,XmlTag::basematerials_abi_cxx11_,(size_t)pcVar5);
            if (iVar7 != 0) goto LAB_00651e9a;
          }
          ReadBaseMaterials(this);
        }
        else {
LAB_00651e9a:
          if (pcVar5 == DAT_008cee10) {
            if (pcVar5 != (char *)0x0) {
              iVar7 = bcmp(local_460,XmlTag::meta_abi_cxx11_,(size_t)pcVar5);
              if (iVar7 != 0) goto LAB_00651dd0;
            }
            ReadMetadata(this);
          }
        }
        goto LAB_00651dd0;
      }
      if (local_458 != (char *)0x0) {
        iVar7 = bcmp(local_460,XmlTag::object_abi_cxx11_,(size_t)local_458);
        if (iVar7 != 0) goto LAB_00651e46;
      }
      local_438 = ReadObject(this,scene);
      if (iStack_480._M_current == local_478) {
        std::vector<aiNode*,std::allocator<aiNode*>>::_M_realloc_insert<aiNode*>
                  ((vector<aiNode*,std::allocator<aiNode*>> *)&local_488,iStack_480,
                   (aiNode **)&local_438);
      }
      else {
        *iStack_480._M_current = local_438;
        iStack_480._M_current = iStack_480._M_current + 1;
      }
      goto LAB_00651dd0;
    }
    paVar9 = scene->mRootNode;
    if ((paVar9->mName).length == 0) {
      (paVar9->mName).length = 3;
      builtin_strncpy((paVar9->mName).data,"3MF",4);
    }
    pMVar1 = (this->mMetaData).
             super__Vector_base<Assimp::D3MF::XmlSerializer::MetaEntry,_std::allocator<Assimp::D3MF::XmlSerializer::MetaEntry>_>
             ._M_impl.super__Vector_impl_data._M_start;
    pMVar2 = (this->mMetaData).
             super__Vector_base<Assimp::D3MF::XmlSerializer::MetaEntry,_std::allocator<Assimp::D3MF::XmlSerializer::MetaEntry>_>
             ._M_impl.super__Vector_impl_data._M_finish;
    if (pMVar1 != pMVar2) {
      uVar13 = (long)pMVar2 - (long)pMVar1 >> 6;
      if ((uint)uVar13 == 0) {
        paVar10 = (aiMetadata *)0x0;
      }
      else {
        paVar10 = (aiMetadata *)operator_new(0x18);
        paVar10->mNumProperties = (uint)uVar13;
        uVar18 = uVar13 & 0xffffffff;
        paVar11 = (aiString *)operator_new__(uVar18 * 0x404);
        paVar14 = paVar11;
        do {
          paVar14->length = 0;
          paVar14->data[0] = '\0';
          memset(paVar14->data + 1,0x1b,0x3ff);
          paVar14 = paVar14 + 1;
        } while (paVar14 != paVar11 + uVar18);
        paVar10->mKeys = paVar11;
        __s = (aiMetadataEntry *)operator_new__(uVar18 << 4);
        memset(__s,0,uVar18 << 4);
        paVar10->mValues = __s;
      }
      scene->mMetaData = paVar10;
      lVar15 = 0x28;
      uVar18 = 0;
      do {
        pMVar1 = (this->mMetaData).
                 super__Vector_base<Assimp::D3MF::XmlSerializer::MetaEntry,_std::allocator<Assimp::D3MF::XmlSerializer::MetaEntry>_>
                 ._M_impl.super__Vector_impl_data._M_start;
        uVar3 = *(ulong *)((long)&(pMVar1->name)._M_dataplus._M_p + lVar15);
        sVar16 = uVar3 & 0xffffffff;
        if ((uVar3 & 0xfffffc00) != 0) {
          sVar16 = 0x3ff;
        }
        memcpy((void *)((long)&local_438 + 4),*(void **)((long)pMVar1 + lVar15 + -8),sVar16);
        *(undefined1 *)((long)&local_438 + sVar16 + 4) = 0;
        paVar10 = scene->mMetaData;
        if (((uint)uVar18 < paVar10->mNumProperties) &&
           (uVar3 = *(ulong *)((long)pMVar1 + lVar15 + -0x20), uVar3 != 0)) {
          uVar17 = uVar18 & 0xffffffff;
          if (uVar3 < 0x400) {
            local_440 = paVar10->mKeys + uVar17;
            paVar14 = paVar10->mKeys + uVar17;
            paVar14->length = (ai_uint32)uVar3;
            local_468 = paVar10;
            memcpy(paVar14->data,*(void **)((long)pMVar1 + lVar15 + -0x28),uVar3);
            local_440->data[uVar3] = '\0';
            paVar10 = local_468;
          }
          paVar10->mValues[uVar17].mType = AI_AISTRING;
          puVar12 = (undefined4 *)operator_new(0x404);
          if (0x3fe < (uint)sVar16) {
            sVar16 = 0x3ff;
          }
          *puVar12 = (int)sVar16;
          memcpy(puVar12 + 1,(void *)((long)&local_438 + 4),sVar16);
          *(undefined1 *)((long)puVar12 + sVar16 + 4) = 0;
          paVar10->mValues[uVar17].mData = puVar12;
        }
        uVar18 = uVar18 + 1;
        lVar15 = lVar15 + 0x40;
      } while (uVar13 + (uVar13 == 0) != uVar18);
    }
    uVar13 = (long)(this->mMeshes).super__Vector_base<aiMesh_*,_std::allocator<aiMesh_*>_>._M_impl.
                   super__Vector_impl_data._M_finish -
             (long)(this->mMeshes).super__Vector_base<aiMesh_*,_std::allocator<aiMesh_*>_>._M_impl.
                   super__Vector_impl_data._M_start;
    scene->mNumMeshes = (uint)(uVar13 >> 3);
    uVar13 = uVar13 & 0x7fffffff8;
    __s_00 = (aiMesh **)operator_new__(uVar13);
    memset(__s_00,0,uVar13);
    scene->mMeshes = __s_00;
    __src = (this->mMeshes).super__Vector_base<aiMesh_*,_std::allocator<aiMesh_*>_>._M_impl.
            super__Vector_impl_data._M_start;
    sVar16 = (long)(this->mMeshes).super__Vector_base<aiMesh_*,_std::allocator<aiMesh_*>_>._M_impl.
                   super__Vector_impl_data._M_finish - (long)__src;
    if (sVar16 != 0) {
      memmove(__s_00,__src,sVar16);
    }
    uVar13 = (long)(this->mMatArray).super__Vector_base<aiMaterial_*,_std::allocator<aiMaterial_*>_>
                   ._M_impl.super__Vector_impl_data._M_finish -
             (long)(this->mMatArray).super__Vector_base<aiMaterial_*,_std::allocator<aiMaterial_*>_>
                   ._M_impl.super__Vector_impl_data._M_start;
    uVar8 = (uint)(uVar13 >> 3);
    scene->mNumMaterials = uVar8;
    if (uVar8 != 0) {
      __dest = (aiMaterial **)operator_new__(uVar13 & 0x7fffffff8);
      scene->mMaterials = __dest;
      __src_00 = (this->mMatArray).super__Vector_base<aiMaterial_*,_std::allocator<aiMaterial_*>_>.
                 _M_impl.super__Vector_impl_data._M_start;
      sVar16 = (long)(this->mMatArray).
                     super__Vector_base<aiMaterial_*,_std::allocator<aiMaterial_*>_>._M_impl.
                     super__Vector_impl_data._M_finish - (long)__src_00;
      if (sVar16 != 0) {
        memmove(__dest,__src_00,sVar16);
      }
    }
    iVar4._M_current = iStack_480._M_current;
    __src_01 = local_488;
    uVar18 = (long)iStack_480._M_current - (long)local_488;
    scene->mRootNode->mNumChildren = (uint)(uVar18 >> 3);
    paVar9 = scene->mRootNode;
    uVar13 = (ulong)paVar9->mNumChildren << 3;
    __s_01 = (aiNode **)operator_new__(uVar13);
    memset(__s_01,0,uVar13);
    paVar9->mChildren = __s_01;
    if (iVar4._M_current != __src_01) {
      memmove(scene->mRootNode->mChildren,__src_01,uVar18);
    }
    if (local_460 != local_450) {
      operator_delete(local_460);
    }
    if (local_488 != (aiNode **)0x0) {
      operator_delete(local_488);
    }
  }
  return;
}

Assistant:

void ImportXml(aiScene* scene) {
        if ( nullptr == scene ) {
            return;
        }

        scene->mRootNode = new aiNode();
        std::vector<aiNode*> children;

        std::string nodeName;
        while(ReadToEndElement(D3MF::XmlTag::model)) {
            nodeName = xmlReader->getNodeName();
            if( nodeName == D3MF::XmlTag::object) {
                children.push_back(ReadObject(scene));
            } else if( nodeName == D3MF::XmlTag::build) {
                // 
            } else if ( nodeName == D3MF::XmlTag::basematerials ) {
                ReadBaseMaterials();
            } else if ( nodeName == D3MF::XmlTag::meta ) {
                ReadMetadata();
            }
        }

        if ( scene->mRootNode->mName.length == 0 ) {
            scene->mRootNode->mName.Set( "3MF" );
        }

        // import the metadata
        if ( !mMetaData.empty() ) {
            const size_t numMeta( mMetaData.size() );
            scene->mMetaData = aiMetadata::Alloc(static_cast<unsigned int>( numMeta ) );
            for ( size_t i = 0; i < numMeta; ++i ) {
                aiString val( mMetaData[ i ].value );
                scene->mMetaData->Set(static_cast<unsigned int>( i ), mMetaData[ i ].name, val );
            }
        }

        // import the meshes
        scene->mNumMeshes = static_cast<unsigned int>( mMeshes.size());
        scene->mMeshes = new aiMesh*[scene->mNumMeshes]();
        std::copy( mMeshes.begin(), mMeshes.end(), scene->mMeshes);

        // import the materials
        scene->mNumMaterials = static_cast<unsigned int>( mMatArray.size() );
        if ( 0 != scene->mNumMaterials ) {
            scene->mMaterials = new aiMaterial*[ scene->mNumMaterials ];
            std::copy( mMatArray.begin(), mMatArray.end(), scene->mMaterials );
        }

        // create the scenegraph
        scene->mRootNode->mNumChildren = static_cast<unsigned int>(children.size());
        scene->mRootNode->mChildren = new aiNode*[scene->mRootNode->mNumChildren]();
        std::copy(children.begin(), children.end(), scene->mRootNode->mChildren);
    }